

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void aom_comp_avg_pred_c(uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,
                        int ref_stride)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = 0;
  uVar2 = 0;
  if (0 < width) {
    uVar2 = (ulong)(uint)width;
  }
  if (height < 1) {
    height = 0;
  }
  for (; iVar1 != height; iVar1 = iVar1 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      comp_pred[uVar3] = (uint8_t)((uint)pred[uVar3] + (uint)ref[uVar3] + 1 >> 1);
    }
    comp_pred = comp_pred + width;
    pred = pred + width;
    ref = ref + ref_stride;
  }
  return;
}

Assistant:

void aom_comp_avg_pred_c(uint8_t *comp_pred, const uint8_t *pred, int width,
                         int height, const uint8_t *ref, int ref_stride) {
  int i, j;

  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      const int tmp = pred[j] + ref[j];
      comp_pred[j] = ROUND_POWER_OF_TWO(tmp, 1);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
  }
}